

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cc
# Opt level: O0

void __thiscall tcmalloc::Sampler::Init(Sampler *this,uint64_t seed)

{
  uint64_t uVar1;
  ssize_t sVar2;
  int local_1c;
  int i;
  uint64_t seed_local;
  Sampler *this_local;
  
  this->rnd_ = seed;
  for (local_1c = 0; local_1c < 0x14; local_1c = local_1c + 1) {
    uVar1 = NextRandom(this->rnd_);
    this->rnd_ = uVar1;
  }
  TrivialOnce::RunOnce<tcmalloc::Sampler::Init(unsigned_long)::__0>(&Init::setup_parameter);
  sVar2 = PickNextSamplingPoint(this);
  this->bytes_until_sample_ = sVar2;
  return;
}

Assistant:

void Sampler::Init(uint64_t seed) {
  DCHECK_NE(seed, 0);

  // Initialize PRNG
  rnd_ = seed;
  // Step it forward 20 times for good measure
  for (int i = 0; i < 20; i++) {
    rnd_ = NextRandom(rnd_);
  }

#ifndef NO_TCMALLOC_SAMPLES
  static TrivialOnce setup_parameter;
  setup_parameter.RunOnce([] () {
    const char* val = GetenvBeforeMain("TCMALLOC_SAMPLE_PARAMETER");
    FLAGS_tcmalloc_sample_parameter = tcmalloc::commandlineflags::StringToLongLong(val, 0);
  });
#endif

  // Initialize counter
  bytes_until_sample_ = PickNextSamplingPoint();
}